

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

char * lower(char *buf,char *s)

{
  char cVar1;
  char *local_20;
  char *p;
  char *s_local;
  char *buf_local;
  
  local_20 = buf;
  for (p = s; *p != '\0'; p = p + 1) {
    if ((*p < 'A') || ('Z' < *p)) {
      cVar1 = *p;
    }
    else {
      cVar1 = *p + ' ';
    }
    *local_20 = cVar1;
    local_20 = local_20 + 1;
  }
  *local_20 = '\0';
  return buf;
}

Assistant:

static const char *lower(char *buf, const char *s)
{
  char *p = buf;
  while (*s) {
    *p++ = (*s >= 'A' && *s <= 'Z') ? *s+0x20 : *s;
    s++;
  }
  *p = '\0';
  return buf;
}